

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall ON_SubDVertex::IsSharp(ON_SubDVertex *this,bool bEndCheck)

{
  ON_SubDEdgePtr *pOVar1;
  bool bVar2;
  ON_SubDEdge *this_00;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  if (((this->m_vertex_tag < 5) && ((0x16U >> (this->m_vertex_tag & 0x1f) & 1) != 0)) &&
     (pOVar1 = this->m_edges, pOVar1 != (ON_SubDEdgePtr *)0x0)) {
    uVar4 = (ulong)this->m_edge_count;
    bVar5 = uVar4 != 0;
    if (bVar5) {
      uVar3 = 1;
      do {
        this_00 = (ON_SubDEdge *)(pOVar1[uVar3 - 1].m_ptr & 0xfffffffffffffff8);
        if ((this_00 != (ON_SubDEdge *)0x0) && (bVar2 = ON_SubDEdge::IsSharp(this_00), bVar2)) {
          if (!bVar5) {
            return false;
          }
          return true;
        }
        bVar5 = uVar3 < uVar4;
        bVar2 = uVar3 != uVar4;
        uVar3 = uVar3 + 1;
      } while (bVar2);
    }
  }
  return false;
}

Assistant:

bool ON_SubDVertex::IsSmoothOrDartOrCrease() const
{
  return (ON_SubDVertexTag::Smooth == m_vertex_tag || ON_SubDVertexTag::Dart == m_vertex_tag || ON_SubDVertexTag::Crease == m_vertex_tag);
}